

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O2

NpyArray * cnpy::npz_load(NpyArray *__return_storage_ptr__,string *fname,string *varname)

{
  ushort uVar1;
  short sVar2;
  uint32_t compr_bytes;
  uint32_t uncompr_bytes;
  __type_conflict _Var3;
  FILE *__stream;
  size_t sVar4;
  runtime_error *prVar5;
  string vname;
  vector<char,_std::allocator<char>_> local_header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  __stream = fopen((fname->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&vname,"npz_load: Unable to open file ",fname);
    std::runtime_error::runtime_error(prVar5,(string *)&vname);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while( true ) {
    std::vector<char,_std::allocator<char>_>::vector(&local_header,0x1e,(allocator_type *)&vname);
    sVar4 = fread(local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,1,0x1e,__stream);
    if (sVar4 != 0x1e) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"npz_load: failed fread");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start[2] != '\x03') ||
       (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
        ._M_start[3] != '\x04')) {
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&local_header.super__Vector_base<char,_std::allocator<char>_>);
      fclose(__stream);
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"npz_load: Variable name ",varname);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_header,&local_50," not found in ");
      std::operator+(&vname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_header,fname);
      std::runtime_error::runtime_error(prVar5,(string *)&vname);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar1 = *(ushort *)
             (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + 0x1a);
    vname._M_dataplus._M_p = (pointer)&vname.field_2;
    std::__cxx11::string::_M_construct((ulong)&vname,(char)uVar1);
    sVar4 = fread(vname._M_dataplus._M_p,1,(ulong)uVar1,__stream);
    if (sVar4 != uVar1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"npz_load: failed fread");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::erase
              (&vname,vname._M_dataplus._M_p + (vname._M_string_length - 4),
               vname._M_dataplus._M_p + vname._M_string_length);
    fseek(__stream,(ulong)*(ushort *)
                           (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + 0x1c),1);
    sVar2 = *(short *)(local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start + 8);
    compr_bytes = *(uint32_t *)
                   (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + 0x12);
    uncompr_bytes =
         *(uint32_t *)
          (local_header.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + 0x16);
    _Var3 = std::operator==(&vname,varname);
    if (_Var3) break;
    fseek(__stream,(ulong)*(uint *)(local_header.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.super__Vector_impl_data._M_start + 0x16),1);
    std::__cxx11::string::~string((string *)&vname);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&local_header.super__Vector_base<char,_std::allocator<char>_>);
  }
  if (sVar2 == 0) {
    load_the_npy_file(__return_storage_ptr__,(FILE *)__stream);
  }
  else {
    load_the_npz_array(__return_storage_ptr__,(FILE *)__stream,compr_bytes,uncompr_bytes);
  }
  fclose(__stream);
  std::__cxx11::string::~string((string *)&vname);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&local_header.super__Vector_base<char,_std::allocator<char>_>);
  return __return_storage_ptr__;
}

Assistant:

cnpy::NpyArray cnpy::npz_load(std::string fname, std::string varname) {
    FILE* fp = fopen(fname.c_str(),"rb");

    if(!fp) throw std::runtime_error("npz_load: Unable to open file "+fname);

    while(1) {
        std::vector<char> local_header(30);
        size_t header_res = fread(&local_header[0],sizeof(char),30,fp);
        if(header_res != 30)
            throw std::runtime_error("npz_load: failed fread");

        //if we've reached the global header, stop reading
        if(local_header[2] != 0x03 || local_header[3] != 0x04) break;

        //read in the variable name
        uint16_t name_len = *(uint16_t*) &local_header[26];
        std::string vname(name_len,' ');
        size_t vname_res = fread(&vname[0],sizeof(char),name_len,fp);      
        if(vname_res != name_len)
            throw std::runtime_error("npz_load: failed fread");
        vname.erase(vname.end()-4,vname.end()); //erase the lagging .npy

        //read in the extra field
        uint16_t extra_field_len = *(uint16_t*) &local_header[28];
        fseek(fp,extra_field_len,SEEK_CUR); //skip past the extra field
        
        uint16_t compr_method = *reinterpret_cast<uint16_t*>(&local_header[0]+8);
        uint32_t compr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+18);
        uint32_t uncompr_bytes = *reinterpret_cast<uint32_t*>(&local_header[0]+22);

        if(vname == varname) {
            NpyArray array  = (compr_method == 0) ? load_the_npy_file(fp) : load_the_npz_array(fp,compr_bytes,uncompr_bytes);
            fclose(fp);
            return array;
        }
        else {
            //skip past the data
            uint32_t size = *(uint32_t*) &local_header[22];
            fseek(fp,size,SEEK_CUR);
        }
    }

    fclose(fp);

    //if we get here, we haven't found the variable in the file
    throw std::runtime_error("npz_load: Variable name "+varname+" not found in "+fname);
}